

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

optional<common::PSBTError> __thiscall
wallet::CWallet::FillPSBT
          (CWallet *this,PartiallySignedTransaction *psbtx,bool *complete,int sighash_type,bool sign
          ,bool bip32derivs,size_t *n_signed,bool finalize)

{
  long lVar1;
  long lVar2;
  PartiallySignedTransaction psbt;
  bool bVar3;
  reference input;
  const_iterator cVar4;
  ulong uVar5;
  _Base_ptr p_Var6;
  uint256 *txhash;
  undefined7 in_register_00000081;
  undefined7 in_register_00000089;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  ulong uStack_2d8;
  uint uStack_2cc;
  int n_signed_this_spkm;
  int sighash_type_local;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock47;
  PartiallySignedTransaction local_298;
  _Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
  local_190;
  PrecomputedTransactionData txdata;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (n_signed != (size_t *)0x0) {
    *n_signed = 0;
  }
  uVar7 = 0;
  sighash_type_local = sighash_type;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock47,&this->cs_wallet,"cs_wallet",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
             ,0x891,false);
  while( true ) {
    uVar5 = (ulong)uVar7;
    lVar2 = *(long *)&(psbtx->tx).super__Optional_base<CMutableTransaction,_false,_false>._M_payload
                      .super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                      super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vin;
    if ((ulong)(((long)*(pointer *)
                        ((long)&(psbtx->tx).super__Optional_base<CMutableTransaction,_false,_false>.
                                _M_payload.
                                super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                                super__Optional_payload_base<CMutableTransaction>._M_payload.
                                _M_value.vin + 8) - lVar2) / 0x68) <= uVar5) break;
    input = std::vector<PSBTInput,_std::allocator<PSBTInput>_>::at(&psbtx->inputs,uVar5);
    bVar3 = PSBTInputSigned(input);
    if (!bVar3 && (input->non_witness_utxo).
                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
      cVar4 = std::
              _Hashtable<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(this->mapWallet)._M_h,(key_type *)(lVar2 + uVar5 * 0x68));
      if (cVar4.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>._M_cur
          != (__node_type *)0x0) {
        std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)input,
                   (__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
                   ((long)cVar4.
                          super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                          ._M_cur + 0x1c0));
      }
    }
    uVar7 = uVar7 + 1;
  }
  PrecomputePSBTData(&txdata,psbtx);
  GetAllScriptPubKeyMans
            ((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
              *)&local_190,this);
  uVar5 = 0;
  uVar9 = 0;
  p_Var6 = local_190._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var6 == &local_190._M_impl.super__Rb_tree_header) {
      std::
      _Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
      ::~_Rb_tree(&local_190);
      RemoveUnnecessaryTransactions(psbtx,&sighash_type_local);
      *complete = true;
      uStack_2cc = 0;
      for (uVar8 = 0;
          uVar8 < (ulong)(((long)(psbtx->inputs).
                                 super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)(psbtx->inputs).
                                super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>._M_impl.
                                super__Vector_impl_data._M_start) / 800); uVar8 = uVar8 + 1) {
        PartiallySignedTransaction::PartiallySignedTransaction(&local_298,psbtx);
        psbt.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
        super__Optional_payload<CMutableTransaction,_true,_false,_false>.
        super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vin.
        super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_finish
             = (pointer)0x0;
        psbt.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
        super__Optional_payload<CMutableTransaction,_true,_false,_false>.
        super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vin.
        super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start =
             (pointer)uStack_2d8;
        psbt.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
        super__Optional_payload<CMutableTransaction,_true,_false,_false>.
        super__Optional_payload_base<CMutableTransaction>._M_payload._16_1_ = finalize;
        psbt.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
        super__Optional_payload<CMutableTransaction,_true,_false,_false>.
        super__Optional_payload_base<CMutableTransaction>._M_payload._17_7_ = 0;
        psbt.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
        super__Optional_payload<CMutableTransaction,_true,_false,_false>.
        super__Optional_payload_base<CMutableTransaction>._M_payload._24_4_ =
             (int)CONCAT71(in_register_00000081,sign);
        psbt.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
        super__Optional_payload<CMutableTransaction,_true,_false,_false>.
        super__Optional_payload_base<CMutableTransaction>._M_payload._28_4_ =
             (int)CONCAT71(in_register_00000089,bip32derivs);
        psbt.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
        super__Optional_payload<CMutableTransaction,_true,_false,_false>.
        super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vout.
        super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)complete;
        psbt.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
        super__Optional_payload<CMutableTransaction,_true,_false,_false>.
        super__Optional_payload_base<CMutableTransaction>._M_payload._40_4_ = n_signed_this_spkm;
        psbt.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
        super__Optional_payload<CMutableTransaction,_true,_false,_false>.
        super__Optional_payload_base<CMutableTransaction>._M_payload._44_4_ = sighash_type_local;
        psbt._48_216_ = _criticalblock47;
        bVar3 = PSBTInputSignedAndVerified
                          (psbt,(uint)&local_298,(PrecomputedTransactionData *)(uVar8 & 0xffffffff))
        ;
        *complete = (bool)(*complete & bVar3);
        PartiallySignedTransaction::~PartiallySignedTransaction(&local_298);
      }
LAB_0046cf80:
      std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&txdata.m_spent_outputs);
      std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock47.super_unique_lock);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return (optional<common::PSBTError>)
               (uVar5 & 0xffffffff | (uVar9 << 0x28) + ((ulong)uStack_2cc << 0x20));
      }
      __stack_chk_fail();
    }
    n_signed_this_spkm = 0;
    uVar5 = (**(code **)(**(long **)(p_Var6 + 1) + 200))
                      (*(long **)(p_Var6 + 1),psbtx,&txdata,sighash_type,sign,bip32derivs,
                       &n_signed_this_spkm,finalize);
    uVar9 = uVar5 >> 0x28;
    if ((uVar5 >> 0x20 & 1) != 0) {
      std::
      _Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
      ::~_Rb_tree(&local_190);
      uStack_2cc = (uint)(uVar5 >> 0x20) & 0xff;
      goto LAB_0046cf80;
    }
    if (n_signed != (size_t *)0x0) {
      *n_signed = *n_signed + (long)n_signed_this_spkm;
    }
    p_Var6 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var6);
  } while( true );
}

Assistant:

std::optional<PSBTError> CWallet::FillPSBT(PartiallySignedTransaction& psbtx, bool& complete, int sighash_type, bool sign, bool bip32derivs, size_t * n_signed, bool finalize) const
{
    if (n_signed) {
        *n_signed = 0;
    }
    LOCK(cs_wallet);
    // Get all of the previous transactions
    for (unsigned int i = 0; i < psbtx.tx->vin.size(); ++i) {
        const CTxIn& txin = psbtx.tx->vin[i];
        PSBTInput& input = psbtx.inputs.at(i);

        if (PSBTInputSigned(input)) {
            continue;
        }

        // If we have no utxo, grab it from the wallet.
        if (!input.non_witness_utxo) {
            const uint256& txhash = txin.prevout.hash;
            const auto it = mapWallet.find(txhash);
            if (it != mapWallet.end()) {
                const CWalletTx& wtx = it->second;
                // We only need the non_witness_utxo, which is a superset of the witness_utxo.
                //   The signing code will switch to the smaller witness_utxo if this is ok.
                input.non_witness_utxo = wtx.tx;
            }
        }
    }

    const PrecomputedTransactionData txdata = PrecomputePSBTData(psbtx);

    // Fill in information from ScriptPubKeyMans
    for (ScriptPubKeyMan* spk_man : GetAllScriptPubKeyMans()) {
        int n_signed_this_spkm = 0;
        const auto error{spk_man->FillPSBT(psbtx, txdata, sighash_type, sign, bip32derivs, &n_signed_this_spkm, finalize)};
        if (error) {
            return error;
        }

        if (n_signed) {
            (*n_signed) += n_signed_this_spkm;
        }
    }

    RemoveUnnecessaryTransactions(psbtx, sighash_type);

    // Complete if every input is now signed
    complete = true;
    for (size_t i = 0; i < psbtx.inputs.size(); ++i) {
        complete &= PSBTInputSignedAndVerified(psbtx, i, &txdata);
    }

    return {};
}